

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerCallIDynamic(Lowerer *this,Instr *callInstr,ushort callFlags)

{
  LowererMDArch *this_00;
  _func_int **pp_Var1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint uVar6;
  Opnd *pOVar7;
  undefined4 *puVar8;
  Opnd *this_01;
  Instr *insertBeforeInstrForCFG;
  Instr *pIVar9;
  undefined1 *puVar10;
  uint uVar11;
  
  bVar4 = Func::GetHasStackArgs(this->m_func);
  if (!bVar4) {
    puVar10 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar10 = 0x24;
    __cxa_throw(puVar10,&Js::RejitException::typeinfo,0);
  }
  pOVar7 = IR::Instr::UnlinkSrc2(callInstr);
  OVar5 = IR::Opnd::GetKind(pOVar7);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  pp_Var1 = pOVar7[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  uVar6 = *(uint *)(pp_Var1 + 3);
  uVar11 = uVar6 & 0x100000;
  if ((uVar11 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
    uVar6 = *(uint *)(pp_Var1 + 3);
    uVar11 = uVar6 & 0x100000;
  }
  if ((uVar6 & 1) == 0 || uVar11 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5532,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  IR::Opnd::Free(pOVar7,this->m_func);
  pIVar9 = (Instr *)pp_Var1[5];
  if (pIVar9->m_opcode != ArgOut_A_Dynamic) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5535,"(argInstr->m_opcode == Js::OpCode::ArgOut_A_Dynamic)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A_Dynamic");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  IR::Instr::Unlink(pIVar9);
  IR::Instr::FreeDst(pIVar9);
  pOVar7 = IR::Instr::UnlinkSrc2(pIVar9);
  OVar5 = IR::Opnd::GetKind(pOVar7);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  pp_Var1 = pOVar7[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  uVar6 = *(uint *)(pp_Var1 + 3);
  uVar11 = uVar6 & 0x100000;
  if ((uVar11 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
    uVar6 = *(uint *)(pp_Var1 + 3);
    uVar11 = uVar6 & 0x100000;
  }
  if ((uVar6 & 1) == 0 || uVar11 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x553d,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  IR::Opnd::Free(pOVar7,this->m_func);
  pIVar2 = (Instr *)pp_Var1[5];
  if (pIVar2->m_opcode != ArgOut_A_FromStackArgs) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5540,"(argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  this_00 = &(this->m_lowererMD).lowererMDArch;
  pOVar7 = LowererMDArch::GenerateArgOutForStackArgs(this_00,callInstr,pIVar2);
  this_01 = IR::Instr::UnlinkSrc2(pIVar2);
  OVar5 = IR::Opnd::GetKind(this_01);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  pp_Var1 = this_01[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar4) goto LAB_005a3c85;
    *puVar8 = 0;
  }
  IR::Opnd::Free(this_01,this->m_func);
  IR::Instr::Remove(pIVar2);
  pIVar2 = (Instr *)pp_Var1[5];
  if (pIVar2->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x554a,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                       "argInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar4) {
LAB_005a3c85:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  insertBeforeInstrForCFG = IR::Instr::GetNextRealInstr(pIVar2);
  IR::Instr::Remove(pIVar2);
  pIVar9 = LowererMDArch::LowerCallIDynamic
                     (this_00,callInstr,pIVar9,pOVar7,callFlags,insertBeforeInstrForCFG);
  return pIVar9;
}

Assistant:

IR::Instr *
Lowerer::LowerCallIDynamic(IR::Instr * callInstr, ushort callFlags)
{
    if (!this->m_func->GetHasStackArgs())
    {
        throw Js::RejitException(RejitReason::InlineApplyDisabled);
    }

    IR::Instr * insertBeforeInstrForCFG = nullptr;

    // Lower args and look for StartCall
    IR::Instr * argInstr = callInstr;
    IR::SymOpnd *   argLinkOpnd = argInstr->UnlinkSrc2()->AsSymOpnd();
    StackSym *      argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);
    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A_Dynamic);

    IR::Instr* saveThisArgOutInstr = argInstr;
    saveThisArgOutInstr->Unlink();
    saveThisArgOutInstr->FreeDst();

    argLinkOpnd = argInstr->UnlinkSrc2()->AsSymOpnd();
    argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);
    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs);

    IR::Opnd* argsLength = m_lowererMD.GenerateArgOutForStackArgs(callInstr, argInstr);

    IR::RegOpnd* startCallDstOpnd = argInstr->UnlinkSrc2()->AsRegOpnd();
    argLinkSym  = startCallDstOpnd->m_sym->AsStackSym();
    startCallDstOpnd->Free(this->m_func);
    argInstr->Remove();// Remove ArgOut_A_FromStackArgs

    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::StartCall);
    insertBeforeInstrForCFG = argInstr->GetNextRealInstr();
    argInstr->Remove(); //Remove start call

    return m_lowererMD.LowerCallIDynamic(callInstr, saveThisArgOutInstr, argsLength, callFlags, insertBeforeInstrForCFG);
}